

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame)

{
  ColoredRect *pCVar1;
  int iVar2;
  ColoredRect *pCVar3;
  const_reference pvVar4;
  int local_50;
  int local_4c;
  int local_48 [5];
  int local_34;
  ColoredRect *local_30;
  ColoredRect *rect;
  size_t drawNdx;
  Frame *local_18;
  Frame *frame_local;
  vector<int,_std::allocator<int>_> *damageRegion;
  
  drawNdx._7_1_ = 0;
  local_18 = frame;
  frame_local = (Frame *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (rect = (ColoredRect *)0x0; pCVar1 = rect,
      pCVar3 = (ColoredRect *)
               std::
               vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ::size(&local_18->draws), pCVar1 < pCVar3;
      rect = (ColoredRect *)((long)(rect->bottomLeft).m_data + 1)) {
    pvVar4 = std::
             vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ::operator[](&local_18->draws,(size_type)rect);
    local_30 = &pvVar4->rect;
    local_34 = tcu::Vector<int,_2>::x(&local_30->bottomLeft);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_34);
    local_48[0] = tcu::Vector<int,_2>::y(&local_30->bottomLeft);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_48);
    iVar2 = tcu::Vector<int,_2>::x(&local_30->topRight);
    local_4c = tcu::Vector<int,_2>::x(&local_30->bottomLeft);
    local_4c = iVar2 - local_4c;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_4c);
    iVar2 = tcu::Vector<int,_2>::y(&local_30->topRight);
    local_50 = tcu::Vector<int,_2>::y(&local_30->bottomLeft);
    local_50 = iVar2 - local_50;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x());
		damageRegion.push_back(rect.bottomLeft.y());
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x());
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y());
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}